

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

IdentifierNameSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::IdentifierNameSyntax,slang::parsing::Token&>
          (BumpAllocator *this,Token *args)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  IdentifierNameSyntax *pIVar6;
  
  pIVar6 = (IdentifierNameSyntax *)allocate(this,0x28,8);
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pIVar6->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind = IdentifierName;
  (pIVar6->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pIVar6->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode = (SyntaxNode *)0x0
  ;
  (pIVar6->identifier).kind = TVar2;
  (pIVar6->identifier).field_0x2 = uVar3;
  (pIVar6->identifier).numFlags = (NumericTokenFlags)NVar4.raw;
  (pIVar6->identifier).rawLen = uVar5;
  (pIVar6->identifier).info = pIVar1;
  return pIVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }